

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int valueFromValueList(sqlite3_value *pVal,sqlite3_value **ppOut,int bNext)

{
  Mem *pMem;
  char *pcVar1;
  u8 uVar2;
  int iVar3;
  u32 amt;
  undefined8 *puVar4;
  ulong uVar5;
  u32 local_6c;
  Mem sMem;
  
  *ppOut = (sqlite3_value *)0x0;
  if (pVal == (sqlite3_value *)0x0) {
    return 0x15;
  }
  iVar3 = 0x1e1ead;
  puVar4 = (undefined8 *)sqlite3_value_pointer(pVal,"ValueList");
  if (puVar4 == (undefined8 *)0x0) {
    return 0x15;
  }
  if (bNext == 0) {
    iVar3 = sqlite3BtreeFirst((BtCursor *)*puVar4,(int *)&sMem);
    if (*(char *)*puVar4 != '\0') {
      return 0x65;
    }
  }
  else {
    iVar3 = sqlite3BtreeNext((BtCursor *)*puVar4,iVar3);
  }
  if (iVar3 == 0) {
    sMem.szMalloc = 0;
    sMem.uTemp = 0;
    sMem.zMalloc = (char *)0x0;
    sMem.n = 0;
    sMem.flags = 0;
    sMem.enc = '\0';
    sMem.eSubtype = '\0';
    sMem.db = (sqlite3 *)0x0;
    sMem.u.r = 0.0;
    sMem.z = (char *)0x0;
    sMem.xDel = (_func_void_void_ptr *)0x0;
    amt = sqlite3BtreePayloadSize((BtCursor *)*puVar4);
    iVar3 = sqlite3VdbeMemFromBtreeZeroOffset((BtCursor *)*puVar4,amt,&sMem);
    pcVar1 = sMem.z;
    if (iVar3 == 0) {
      pMem = (Mem *)puVar4[1];
      if (sMem.z[1] < '\0') {
        uVar2 = sqlite3GetVarint32((uchar *)(sMem.z + 1),&local_6c);
        uVar5 = (ulong)(byte)(uVar2 + 1);
      }
      else {
        uVar5 = 2;
        local_6c = (int)sMem.z[1];
      }
      sqlite3VdbeSerialGet((uchar *)(pcVar1 + uVar5),local_6c,pMem);
      pMem->enc = pMem->db->enc;
      if (((pMem->flags & 0x4000) == 0) || (iVar3 = sqlite3VdbeMemMakeWriteable(pMem), iVar3 == 0))
      {
        *ppOut = pMem;
        iVar3 = 0;
      }
      else {
        iVar3 = 7;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
    return iVar3;
  }
  return iVar3;
}

Assistant:

static int valueFromValueList(
  sqlite3_value *pVal,        /* Pointer to the ValueList object */
  sqlite3_value **ppOut,      /* Store the next value from the list here */
  int bNext                   /* 1 for _next(). 0 for _first() */
){
  int rc;
  ValueList *pRhs;

  *ppOut = 0;
  if( pVal==0 ) return SQLITE_MISUSE;
  pRhs = (ValueList*)sqlite3_value_pointer(pVal, "ValueList");
  if( pRhs==0 ) return SQLITE_MISUSE;
  if( bNext ){
    rc = sqlite3BtreeNext(pRhs->pCsr, 0);
  }else{
    int dummy = 0;
    rc = sqlite3BtreeFirst(pRhs->pCsr, &dummy);
    assert( rc==SQLITE_OK || sqlite3BtreeEof(pRhs->pCsr) );
    if( sqlite3BtreeEof(pRhs->pCsr) ) rc = SQLITE_DONE;
  }
  if( rc==SQLITE_OK ){
    u32 sz;       /* Size of current row in bytes */
    Mem sMem;     /* Raw content of current row */
    memset(&sMem, 0, sizeof(sMem));
    sz = sqlite3BtreePayloadSize(pRhs->pCsr);
    rc = sqlite3VdbeMemFromBtreeZeroOffset(pRhs->pCsr,(int)sz,&sMem);
    if( rc==SQLITE_OK ){
      u8 *zBuf = (u8*)sMem.z;
      u32 iSerial;
      sqlite3_value *pOut = pRhs->pOut;
      int iOff = 1 + getVarint32(&zBuf[1], iSerial);
      sqlite3VdbeSerialGet(&zBuf[iOff], iSerial, pOut);
      pOut->enc = ENC(pOut->db);
      if( (pOut->flags & MEM_Ephem)!=0 && sqlite3VdbeMemMakeWriteable(pOut) ){
        rc = SQLITE_NOMEM;
      }else{
        *ppOut = pOut;
      }
    }
    sqlite3VdbeMemRelease(&sMem);
  }
  return rc;
}